

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gls::fboc::details::TestBase::iterate(TestBase *this)

{
  FormatDB *db;
  _Rb_tree_node_base *format;
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  Context *pCVar3;
  TestLog *log;
  ImageFormat db_00;
  ImageFormat db_01;
  ImageFormat db_02;
  ImageFormat db_03;
  ImageFormat db_04;
  ImageFormat db_05;
  ImageFormat db_06;
  bool bVar4;
  int iVar5;
  IterateResult IVar6;
  GLenum fboStatus;
  undefined4 extraout_var;
  ObjectTraits *traits;
  undefined4 extraout_var_00;
  _Base_ptr p_Var7;
  size_t sVar8;
  undefined4 extraout_var_01;
  long *plVar9;
  long *plVar10;
  char *pcVar11;
  long lVar12;
  FormatDB *db_07;
  qpTestResult qVar13;
  char *pcVar14;
  MessageBuilder *in_R8;
  FormatFlags feature;
  FormatFlags feature_00;
  set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  formats;
  ScopedLogSection section;
  ScopedLogSection supersection;
  MessageBuilder msg;
  ValidStatusCodes reference;
  Framebuffer fbo;
  FboBuilder builder;
  string local_370;
  FormatDB *local_350;
  IterateResult local_344;
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  local_340;
  ScopedLogSection local_310;
  ScopedLogSection local_308;
  string local_300;
  TestBase *local_2e0;
  _Rb_tree_node_base *local_2d8;
  undefined1 local_2d0 [8];
  undefined1 local_2c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0 [6];
  ios_base local_260 [8];
  ios_base local_258 [264];
  ValidStatusCodes local_150;
  ObjectWrapper local_118;
  FboBuilder local_100;
  
  iVar5 = (*this->m_ctx->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_118,(Functions *)CONCAT44(extraout_var,iVar5),traits);
  iVar5 = (*this->m_ctx->m_renderCtx->_vptr_RenderContext[3])();
  FboUtil::FboBuilder::FboBuilder
            (&local_100,local_118.m_object,0x8d40,(Functions *)CONCAT44(extraout_var_00,iVar5));
  IVar6 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,&local_100);
  FboUtil::FboVerifier::validStatusCodes
            (&local_150,&this->m_ctx->m_verifier,&local_100.super_Framebuffer);
  FboUtil::logFramebufferConfig
            (&local_100.super_Framebuffer,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  pCVar3 = this->m_ctx;
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_340._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_340._M_impl.super__Rb_tree_header._M_header;
  local_340._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)local_340._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  local_340._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_340._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_100.super_Framebuffer.textures._M_t._M_impl.super__Rb_tree_header;
  local_340._M_impl.super__Rb_tree_header._M_header._M_right =
       local_340._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)
      local_100.super_Framebuffer.textures._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      p_Var2) {
    p_Var7 = local_100.super_Framebuffer.textures._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    do {
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
      ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
                ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
                  *)&local_340,(ImageFormat *)&(p_Var7[1]._M_parent)->_M_parent);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var2);
  }
  p_Var2 = &local_100.super_Framebuffer.rbos._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)
      local_100.super_Framebuffer.rbos._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      p_Var2) {
    p_Var7 = local_100.super_Framebuffer.rbos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
      ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
                ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
                  *)&local_340,(ImageFormat *)&(p_Var7[1]._M_parent)->_M_parent);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var2);
  }
  if (local_340._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_2c0[0]._M_allocated_capacity._0_4_ = 0x6d726f46;
    local_2c0[0]._M_allocated_capacity._4_2_ = 0x7461;
    local_2c8 = (undefined1  [8])0x6;
    local_2c0[0]._M_local_buf[6] = '\0';
    local_370.field_2._M_allocated_capacity._0_7_ = 0x2074616d726f46;
    local_370.field_2._M_local_buf[7] = 'i';
    local_370.field_2._8_2_ = 0x666e;
    local_370.field_2._M_local_buf[10] = 'o';
    local_370._M_string_length = 0xb;
    local_370.field_2._M_local_buf[0xb] = '\0';
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    local_2d0 = (undefined1  [8])(local_2c8 + 8);
    tcu::ScopedLogSection::ScopedLogSection(&local_308,log,(string *)local_2d0,&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,
                      CONCAT17(local_370.field_2._M_local_buf[7],
                               local_370.field_2._M_allocated_capacity._0_7_) + 1);
    }
    local_344 = IVar6;
    local_2e0 = this;
    if (local_2d0 != (undefined1  [8])(local_2c8 + 8)) {
      operator_delete((void *)local_2d0,
                      CONCAT17(local_2c0[0]._M_local_buf[7],
                               CONCAT16(local_2c0[0]._M_local_buf[6],
                                        CONCAT24(local_2c0[0]._M_allocated_capacity._4_2_,
                                                 (undefined4)local_2c0[0]._M_allocated_capacity))) +
                      1);
    }
    if ((_Rb_tree_header *)local_340._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_340._M_impl.super__Rb_tree_header) {
      db = &pCVar3->m_ctxFormats;
      local_350 = &pCVar3->m_coreFormats;
      db_07 = &pCVar3->m_allFormats;
      p_Var7 = local_340._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        local_370.field_2._M_allocated_capacity._0_7_ = 0x4974616d726f46;
        local_370.field_2._M_local_buf[7] = 'n';
        local_370.field_2._8_2_ = 0x6f66;
        local_370._M_string_length = 10;
        local_370.field_2._M_local_buf[10] = '\0';
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
        format = p_Var7 + 1;
        FboUtil::operator<<((ostream *)local_2d0,(ImageFormat *)format);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
        std::ios_base::~ios_base(local_260);
        tcu::ScopedLogSection::ScopedLogSection(&local_310,log,&local_370,&local_300);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,
                          CONCAT17(local_370.field_2._M_local_buf[7],
                                   local_370.field_2._M_allocated_capacity._0_7_) + 1);
        }
        bVar4 = isFormatFeatureSupported(db,(ImageFormat *)format,TEXTURE_VALID);
        local_2d0 = (undefined1  [8])log;
        if (bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2c8,"* Valid texture format\n",0x17);
          bVar4 = isFormatFeatureSupported(local_350,(ImageFormat *)format,TEXTURE_VALID);
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2c8,"\t* core feature",0xf);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2c8,"\t* defined in supported extension(s):\n",0x26);
            db_01.format = format->_M_color;
            db_01.unsizedType = *(GLenum *)&format->field_0x4;
            logAffectingExtensions
                      ((char *)db,(FormatDB *)db_01,(ImageFormat *)&DAT_00000010,
                       (FormatFlags)local_2d0,in_R8);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2c8,"* Unsupported texture format\n",0x1d);
          bVar4 = isFormatFeatureSupported(db_07,(ImageFormat *)format,TEXTURE_VALID);
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2c8,"\t* requires any of the extensions or combinations:\n",
                       0x33);
            db_00.format = format->_M_color;
            db_00.unsizedType = *(GLenum *)&format->field_0x4;
            logAffectingExtensions
                      ((char *)db_07,(FormatDB *)db_00,(ImageFormat *)&DAT_00000010,
                       (FormatFlags)local_2d0,in_R8);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2c8,"\t* no extension can make this format valid",0x2a);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
        std::ios_base::~ios_base(local_258);
        bVar4 = isFormatFeatureSupported(db,(ImageFormat *)format,RENDERBUFFER_VALID);
        local_2d8 = p_Var7;
        if (bVar4) {
          local_2d0 = (undefined1  [8])log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2c8,"* Valid renderbuffer format\n",0x1c);
          bVar4 = isFormatFeatureSupported(local_350,(ImageFormat *)format,RENDERBUFFER_VALID);
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2c8,"\t* core feature",0xf);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2c8,"\t* defined in supported extension(s):\n",0x26);
            db_03.format = format->_M_color;
            db_03.unsizedType = *(GLenum *)&format->field_0x4;
            logAffectingExtensions
                      ((char *)db,(FormatDB *)db_03,(ImageFormat *)0x8,(FormatFlags)local_2d0,in_R8)
            ;
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          local_2d0 = (undefined1  [8])log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2c8,"* Unsupported renderbuffer format\n",0x22);
          bVar4 = isFormatFeatureSupported(db_07,(ImageFormat *)format,RENDERBUFFER_VALID);
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2c8,"\t* requires any of the extensions or combinations:\n",
                       0x33);
            db_02.format = format->_M_color;
            db_02.unsizedType = *(GLenum *)&format->field_0x4;
            logAffectingExtensions
                      ((char *)db_07,(FormatDB *)db_02,(ImageFormat *)0x8,(FormatFlags)local_2d0,
                       in_R8);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2c8,"\t* no extension can make this format valid",0x2a);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
        std::ios_base::~ios_base(local_258);
        lVar12 = 0;
        do {
          feature_00 = *(FormatFlags *)(&DAT_02184ed8 + lVar12);
          feature = feature_00 | REQUIRED_RENDERABLE;
          bVar4 = isFormatFeatureSupported(db,(ImageFormat *)format,feature);
          iVar5 = (int)(ostringstream *)local_2c8;
          if (bVar4) {
            local_2d0 = (undefined1  [8])log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2c8,"* Format is ",0xc);
            pcVar11 = *(char **)((long)&logFormatInfo(deqp::gls::FboUtil::config::Framebuffer_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,tcu::TestLog&)
                                        ::s_renderability + lVar12);
            if (pcVar11 == (char *)0x0) {
              std::ios::clear((int)*(_func_int **)((long)local_2c8 + -0x18) + iVar5);
            }
            else {
              sVar8 = strlen(pcVar11);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar11,sVar8)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"\n",1);
            bVar4 = isFormatFeatureSupported(local_350,(ImageFormat *)format,feature);
            if (bVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2c8,"\t* core feature",0xf);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2c8,"\t* defined in supported extension(s):\n",0x26);
              db_04.format = format->_M_color;
              db_04.unsizedType = *(GLenum *)&format->field_0x4;
              logAffectingExtensions
                        ((char *)db,(FormatDB *)db_04,(ImageFormat *)(ulong)feature,
                         (FormatFlags)local_2d0,in_R8);
            }
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            bVar4 = isFormatFeatureSupported(db,(ImageFormat *)format,feature_00);
            if (bVar4) {
              local_2d0 = (undefined1  [8])log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2c8,"* Format is allowed to be ",0x1a);
              pcVar11 = *(char **)((long)&logFormatInfo(deqp::gls::FboUtil::config::Framebuffer_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,tcu::TestLog&)
                                          ::s_renderability + lVar12);
              if (pcVar11 == (char *)0x0) {
                std::ios::clear((int)*(_func_int **)((long)local_2c8 + -0x18) + iVar5);
              }
              else {
                sVar8 = strlen(pcVar11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2c8,pcVar11,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2c8," but not required\n",0x12);
              bVar4 = isFormatFeatureSupported(local_350,(ImageFormat *)format,feature_00);
              sVar8 = 0xf;
              pcVar14 = "\t* core feature";
              if (bVar4) {
LAB_017f5b56:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2c8,pcVar14,sVar8);
              }
              else {
                bVar4 = isFormatFeatureSupported(db_07,(ImageFormat *)format,feature_00);
                if (bVar4) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2c8,"\t* extensions that would make format ",0x25);
                  if (pcVar11 == (char *)0x0) {
                    std::ios::clear((int)*(_func_int **)((long)local_2c8 + -0x18) + iVar5);
                  }
                  else {
                    sVar8 = strlen(pcVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2c8,pcVar11,sVar8);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,":\n",2);
                  db_05.format = format->_M_color;
                  db_05.unsizedType = *(GLenum *)&format->field_0x4;
                  logAffectingExtensions
                            ((char *)db_07,(FormatDB *)db_05,(ImageFormat *)(ulong)feature_00,
                             (FormatFlags)local_2d0,in_R8);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2c8,"\t* no extension can make this format ",0x25);
                  if (pcVar11 != (char *)0x0) {
                    sVar8 = strlen(pcVar11);
                    pcVar14 = pcVar11;
                    goto LAB_017f5b56;
                  }
                  std::ios::clear((int)*(_func_int **)((long)local_2c8 + -0x18) + iVar5);
                }
              }
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
            else {
              local_2d0 = (undefined1  [8])log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2c8,"* Format is NOT ",0x10);
              pcVar11 = *(char **)((long)&logFormatInfo(deqp::gls::FboUtil::config::Framebuffer_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,tcu::TestLog&)
                                          ::s_renderability + lVar12);
              if (pcVar11 == (char *)0x0) {
                std::ios::clear((int)*(_func_int **)((long)local_2c8 + -0x18) + iVar5);
              }
              else {
                sVar8 = strlen(pcVar11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2c8,pcVar11,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"\n",1);
              bVar4 = isFormatFeatureSupported(db_07,(ImageFormat *)format,feature_00);
              if (bVar4) {
                bVar4 = isFormatFeatureSupported(db_07,(ImageFormat *)format,feature);
                if (bVar4) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2c8,"\t* extensions that would make format ",0x25);
                  if (pcVar11 == (char *)0x0) {
                    std::ios::clear((int)*(_func_int **)((long)local_2c8 + -0x18) + iVar5);
                  }
                  else {
                    sVar8 = strlen(pcVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2c8,pcVar11,sVar8);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,":\n",2);
                  feature_00 = feature;
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2c8,"\t* extensions that are allowed to make format ",
                             0x2e);
                  if (pcVar11 == (char *)0x0) {
                    std::ios::clear((int)*(_func_int **)((long)local_2c8 + -0x18) + iVar5);
                  }
                  else {
                    sVar8 = strlen(pcVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2c8,pcVar11,sVar8);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,":\n",2);
                }
                db_06.format = format->_M_color;
                db_06.unsizedType = *(GLenum *)&format->field_0x4;
                logAffectingExtensions
                          ((char *)db_07,(FormatDB *)db_06,(ImageFormat *)(ulong)feature_00,
                           (FormatFlags)local_2d0,in_R8);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2c8,"\t* no extension can make this format ",0x25);
                if (pcVar11 == (char *)0x0) {
                  std::ios::clear((int)*(_func_int **)((long)local_2c8 + -0x18) + iVar5);
                }
                else {
                  sVar8 = strlen(pcVar11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2c8,pcVar11,sVar8);
                }
              }
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
          std::ios_base::~ios_base(local_258);
          lVar12 = lVar12 + 0x10;
        } while (lVar12 != 0x30);
        tcu::TestLog::endSection(local_310.m_log);
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_2d8);
      } while ((_Rb_tree_header *)p_Var7 != &local_340._M_impl.super__Rb_tree_header);
    }
    tcu::TestLog::endSection(local_308.m_log);
    this = local_2e0;
    IVar6 = local_344;
  }
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::~_Rb_tree(&local_340);
  FboUtil::ValidStatusCodes::logRules
            (&local_150,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  FboUtil::ValidStatusCodes::logLegalResults
            (&local_150,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  if (local_100.m_error != 0) {
    local_2d0 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"Received ",9);
    local_340._M_impl._0_8_ = glu::getErrorName;
    local_340._M_impl.super__Rb_tree_header._M_header._M_color = local_100.m_error;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_340,(ostream *)local_2c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8," (during FBO initialization).",0x1d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
    std::ios_base::~ios_base(local_258);
    bVar4 = FboUtil::ValidStatusCodes::isErrorCodeValid(&local_150,local_100.m_error);
    if (bVar4) {
      pcVar11 = "Pass";
      qVar13 = QP_TEST_RESULT_PASS;
    }
    else {
      bVar4 = FboUtil::ValidStatusCodes::isErrorCodeRequired(&local_150,0);
      if (bVar4) {
        local_300._M_dataplus._M_p = (pointer)glu::getErrorName;
        local_300._M_string_length._0_4_ = local_100.m_error;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_300,(ostream *)local_2d0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
        std::ios_base::~ios_base(local_260);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_370,0,(char *)0x0,0x1caea33);
        pp_Var1 = &local_340._M_impl.super__Rb_tree_header._M_header._M_parent;
        plVar10 = plVar9 + 2;
        if ((_Base_ptr *)*plVar9 == (_Base_ptr *)plVar10) {
          local_340._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar10;
          local_340._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar9[3];
          local_340._M_impl._0_8_ = pp_Var1;
        }
        else {
          local_340._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar10;
          local_340._M_impl._0_8_ = (_Base_ptr *)*plVar9;
        }
        local_340._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar9[1];
        *plVar9 = (long)plVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   (char *)local_340._M_impl._0_8_);
        if ((_Base_ptr *)local_340._M_impl._0_8_ != pp_Var1) {
          operator_delete((void *)local_340._M_impl._0_8_,
                          (ulong)((long)&(local_340._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,
                          CONCAT17(local_370.field_2._M_local_buf[7],
                                   local_370.field_2._M_allocated_capacity._0_7_) + 1);
        }
        goto LAB_017f60d1;
      }
      pcVar11 = "Got wrong error code";
      qVar13 = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult((this->super_TestCase).super_TestNode.m_testCtx,qVar13,pcVar11);
    goto LAB_017f60d1;
  }
  iVar5 = (*this->m_ctx->m_renderCtx->_vptr_RenderContext[3])();
  fboStatus = (**(code **)(CONCAT44(extraout_var_01,iVar5) + 0x170))(0x8d40);
  bVar4 = FboUtil::ValidStatusCodes::isFBOStatusValid(&local_150,fboStatus);
  local_2d0 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"Received ",9);
  local_340._M_impl._0_8_ = glu::getFramebufferStatusName;
  local_340._M_impl.super__Rb_tree_header._M_header._M_color = fboStatus;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_340,(ostream *)local_2c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
  std::ios_base::~ios_base(local_258);
  if (bVar4) {
    if (fboStatus != 0x8cd5) {
      bVar4 = FboUtil::ValidStatusCodes::isFBOStatusValid(&local_150,0x8cd5);
      if (bVar4) {
        pcVar11 = "Framebuffer object could have checked as complete but did not.";
        qVar13 = QP_TEST_RESULT_QUALITY_WARNING;
        goto LAB_017f6062;
      }
    }
    pcVar11 = "Pass";
    qVar13 = QP_TEST_RESULT_PASS;
  }
  else {
    qVar13 = QP_TEST_RESULT_FAIL;
    if (fboStatus == 0x8cd5) {
      pcVar11 = "Framebuffer checked as complete, expected incomplete";
    }
    else {
      bVar4 = FboUtil::ValidStatusCodes::isFBOStatusRequired(&local_150,0x8cd5);
      pcVar11 = "Framebuffer checked as incomplete, but with wrong status";
      if (bVar4) {
        pcVar11 = "Framebuffer checked is incomplete, expected complete";
      }
    }
  }
LAB_017f6062:
  tcu::TestContext::setTestResult((this->super_TestCase).super_TestNode.m_testCtx,qVar13,pcVar11);
LAB_017f60d1:
  std::
  vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
  ::~vector(&local_150.m_errorStatuses);
  std::
  vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
  ::~vector(&local_150.m_errorCodes);
  FboUtil::FboBuilder::~FboBuilder(&local_100);
  glu::ObjectWrapper::~ObjectWrapper(&local_118);
  return IVar6;
}

Assistant:

IterateResult TestBase::iterate (void)
{
	glu::Framebuffer		fbo			(m_ctx.getRenderContext());
	FboBuilder				builder		(*fbo, GL_FRAMEBUFFER, gl(*this));
	const IterateResult		ret			= build(builder);
	const ValidStatusCodes	reference	= m_ctx.getVerifier().validStatusCodes(builder);
	const GLenum			errorCode	= builder.getError();

	logFramebufferConfig(builder, m_testCtx.getLog());
	logFormatInfo(builder, m_ctx.getCtxFormats(), m_ctx.getCoreFormats(), m_ctx.getAllFormats(), m_testCtx.getLog());
	reference.logRules(m_testCtx.getLog());
	reference.logLegalResults(m_testCtx.getLog());

	// \todo [2013-12-04 lauri] Check if drawing operations succeed.

	if (errorCode != GL_NO_ERROR)
	{
		m_testCtx.getLog()
			<< TestLog::Message
			<< "Received " << glu::getErrorStr(errorCode) << " (during FBO initialization)."
			<< TestLog::EndMessage;

		if (reference.isErrorCodeValid(errorCode))
			pass();
		else if (reference.isErrorCodeRequired(GL_NO_ERROR))
			fail(("Expected no error but got " + de::toString(glu::getErrorStr(errorCode))).c_str());
		else
			fail("Got wrong error code");
	}
	else
	{
		const GLenum	fboStatus	= gl(*this).checkFramebufferStatus(GL_FRAMEBUFFER);
		const bool		validStatus	= reference.isFBOStatusValid(fboStatus);

		m_testCtx.getLog()
			<< TestLog::Message
			<< "Received " << glu::getFramebufferStatusStr(fboStatus) << "."
			<< TestLog::EndMessage;

		if (!validStatus)
		{
			if (fboStatus == GL_FRAMEBUFFER_COMPLETE)
				fail("Framebuffer checked as complete, expected incomplete");
			else if (reference.isFBOStatusRequired(GL_FRAMEBUFFER_COMPLETE))
				fail("Framebuffer checked is incomplete, expected complete");
			else
				// An incomplete status is allowed, but not _this_ incomplete status.
				fail("Framebuffer checked as incomplete, but with wrong status");
		}
		else if (fboStatus != GL_FRAMEBUFFER_COMPLETE && reference.isFBOStatusValid(GL_FRAMEBUFFER_COMPLETE))
			qualityWarning("Framebuffer object could have checked as complete but did not.");
		else
			pass();
	}

	return ret;
}